

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

Float __thiscall pbrt::LightBounds::Importance(LightBounds *this,Point3f p,Normal3f n)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [60];
  undefined1 auVar18 [64];
  undefined1 auVar20 [64];
  Point3f PVar21;
  Vector3<float> VVar22;
  Vector3<float> VVar23;
  Tuple3<pbrt::Normal3,_float> local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  Tuple3<pbrt::Vector3,_float> local_78;
  undefined1 local_68 [16];
  DirectionCone local_50;
  Point3<float> local_38;
  Point3<float> local_28;
  undefined1 extraout_var [60];
  
  local_a8.z = n.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar20._8_56_ = n._8_56_;
  auVar20._0_8_ = n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  local_28.super_Tuple3<pbrt::Point3,_float>.z = p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar13._8_56_ = p._8_56_;
  auVar13._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_98 = auVar20._0_16_;
  local_a8._0_8_ = vmovlps_avx(local_98);
  local_28.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar13._0_16_);
  PVar21 = Centroid(this);
  local_38.super_Tuple3<pbrt::Point3,_float>.z = PVar21.super_Tuple3<pbrt::Point3,_float>.z;
  auVar14._0_8_ = PVar21.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar14._8_56_ = auVar13._8_56_;
  local_38.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar14._0_16_);
  fVar10 = DistanceSquared<float>(&local_28,&local_38);
  auVar13._8_56_ = extraout_var_00;
  VVar22 = Bounds3<float>::Diagonal(&this->b);
  auVar15._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15._8_56_ = auVar13._8_56_;
  local_68 = auVar15._0_16_;
  auVar11._8_8_ = 0;
  auVar11._0_4_ = local_28.super_Tuple3<pbrt::Point3,_float>.x;
  auVar11._4_4_ = local_28.super_Tuple3<pbrt::Point3,_float>.y;
  auVar7._8_8_ = 0;
  auVar7._0_4_ = local_38.super_Tuple3<pbrt::Point3,_float>.x;
  auVar7._4_4_ = local_38.super_Tuple3<pbrt::Point3,_float>.y;
  auVar8 = vsubps_avx(auVar11,auVar7);
  auVar13._8_56_ = ZEXT856(auVar8._8_8_);
  local_50.w.super_Tuple3<pbrt::Vector3,_float>.z =
       local_28.super_Tuple3<pbrt::Point3,_float>.z - local_38.super_Tuple3<pbrt::Point3,_float>.z;
  auVar19 = (undefined1  [60])0x0;
  local_50.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar8);
  VVar23 = Normalize<float>(&local_50.w);
  auVar18._0_4_ = VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._4_60_ = auVar19;
  auVar16._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar13._8_56_;
  auVar6 = auVar16._0_16_;
  local_78._0_8_ = vmovlps_avx(auVar6);
  auVar8 = vmovshdup_avx(auVar6);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ *
                                         (this->w).super_Tuple3<pbrt::Vector3,_float>.y)),auVar6,
                           ZEXT416((uint)(this->w).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar8 = vfmadd231ss_fma(auVar8,auVar18._0_16_,
                           ZEXT416((uint)(this->w).super_Tuple3<pbrt::Vector3,_float>.z));
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar6 = vandps_avx512vl(auVar8,auVar6);
  local_88._4_12_ = auVar8._4_12_;
  local_88._0_4_ =
       (uint)(this->twoSided & 1) * auVar6._0_4_ + (uint)!(bool)(this->twoSided & 1) * auVar8._0_4_;
  local_78.z = auVar18._0_4_;
  BoundSubtendedDirections(&local_50,&this->b,&local_28);
  auVar6 = ZEXT816(0) << 0x40;
  auVar8._8_4_ = 0x80000000;
  auVar8._0_8_ = 0x8000000080000000;
  auVar8._12_4_ = 0x80000000;
  auVar7 = vxorps_avx512vl(local_88,auVar8);
  auVar8 = vfnmadd213ss_fma(ZEXT416((uint)local_50.cosTheta),ZEXT416((uint)local_50.cosTheta),
                            SUB6416(ZEXT464(0x3f800000),0));
  auVar8 = vmaxss_avx(auVar8,auVar6);
  auVar11 = vsqrtss_avx(auVar8,auVar8);
  fVar5 = this->cosTheta_o;
  auVar8 = vinsertps_avx(local_88,ZEXT416((uint)fVar5),0x10);
  auVar1._8_4_ = 0x3f800000;
  auVar1._0_8_ = 0x3f8000003f800000;
  auVar1._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_avx512vl(auVar8,auVar8,auVar1);
  bVar4 = fVar5 < local_88._0_4_;
  auVar8 = vmaxps_avx(auVar8,ZEXT816(0) << 0x40);
  auVar1 = vsqrtps_avx(auVar8);
  auVar8 = vmovshdup_avx(auVar1);
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ * auVar7._0_4_)),auVar1,ZEXT416((uint)fVar5))
  ;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar1._0_4_ * auVar8._0_4_)),ZEXT416((uint)fVar5),
                           local_88);
  auVar9._4_12_ = auVar8._4_12_;
  auVar9._0_4_ = (uint)bVar4 * 0x3f800000 + (uint)!bVar4 * auVar8._0_4_;
  uVar2 = vcmpss_avx512f(ZEXT416((uint)local_50.cosTheta),auVar9,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * (float)((uint)!bVar4 * auVar7._0_4_))),
                           auVar9,ZEXT416((uint)local_50.cosTheta));
  fVar5 = (float)((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * auVar8._0_4_);
  if (this->cosTheta_e < fVar5) {
    auVar12._0_4_ = local_68._0_4_ * local_68._0_4_;
    auVar12._4_4_ = local_68._4_4_ * local_68._4_4_;
    auVar12._8_4_ = local_68._8_4_ * local_68._8_4_;
    auVar12._12_4_ = local_68._12_4_ * local_68._12_4_;
    auVar8 = vmovshdup_avx(auVar12);
    auVar8 = vfmadd231ss_fma(auVar8,local_68,local_68);
    auVar8 = vfmadd213ss_fma(ZEXT416((uint)VVar22.super_Tuple3<pbrt::Vector3,_float>.z),
                             ZEXT416((uint)VVar22.super_Tuple3<pbrt::Vector3,_float>.z),auVar8);
    auVar8 = vsqrtss_avx(auVar8,auVar8);
    auVar8 = vmaxss_avx(ZEXT416((uint)(auVar8._0_4_ * 0.5)),ZEXT416((uint)fVar10));
    fVar5 = (fVar5 * this->phi) / auVar8._0_4_;
    if ((((local_98._0_4_ != 0.0) || (auVar8 = vmovshdup_avx(local_98), auVar8._0_4_ != 0.0)) ||
        (local_a8.z != 0.0)) || (NAN(local_a8.z))) {
      local_98._0_4_ = local_50.cosTheta;
      local_88._0_4_ = fVar5;
      auVar17._0_4_ = AbsDot<float>((Vector3<float> *)&local_78,(Normal3<float> *)&local_a8);
      auVar17._4_60_ = extraout_var;
      auVar6 = auVar17._0_16_;
      auVar8 = vfnmadd213ss_fma(auVar6,auVar6,SUB6416(ZEXT464(0x3f800000),0));
      auVar8 = vmaxss_avx(auVar8,ZEXT416(0));
      uVar2 = vcmpss_avx512f(ZEXT416((uint)local_98._0_4_),auVar6,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ * auVar11._0_4_)),auVar6,
                               ZEXT416((uint)local_98._0_4_));
      fVar5 = (float)local_88._0_4_ *
              (float)((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * auVar8._0_4_);
    }
    auVar6 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar5));
  }
  return auVar6._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Importance(Point3f p, Normal3f n) const {
        // Compute clamped squared distance to _intr_
        Point3f pc = Centroid();
        Float d2 = DistanceSquared(p, pc);
        // Don't let d2 get too small if p is inside the bounds.
        d2 = std::max(d2, Length(b.Diagonal()) / 2);

        Vector3f wi = Normalize(p - pc);

        Float cosTheta = Dot(w, wi);
        if (twoSided)
            cosTheta = std::abs(cosTheta);
#if 0
    else if (cosTheta < 0 && cosTheta_o == 1) {
        // Catch the case where the point is outside the bounds and definitely
        // not in the emitted cone even though the conservative theta_u test
        // make suggest it could be.
        // Doesn't seem to make much difference in practice.
        if ((p.x < b.pMin.x || p.x > b.pMax.x) &&
            (p.y < b.pMin.y || p.y > b.pMax.y) &&
            (p.z < b.pMin.z || p.z > b.pMax.z))
            return 0;
    }
#endif

        // FIXME? unstable when cosTheta \approx 1
        Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);

        // Define sine and cosine clamped subtraction lambdas
        // cos(max(0, a-b))
        auto cosSubClamped = [](Float sinThetaA, Float cosThetaA, Float sinThetaB,
                                Float cosThetaB) -> Float {
            if (cosThetaA > cosThetaB)
                // Handle the max(0, ...)
                return 1;
            return cosThetaA * cosThetaB + sinThetaA * sinThetaB;
        };
        // sin(max(0, a-b))
        auto sinSubClamped = [](Float sinThetaA, Float cosThetaA, Float sinThetaB,
                                Float cosThetaB) -> Float {
            if (cosThetaA > cosThetaB)
                // Handle the max(0, ...)
                return 0;
            return sinThetaA * cosThetaB - cosThetaA * sinThetaB;
        };

        // Compute $\cos \theta_\roman{u}$ for _intr_
        Float cosTheta_u = BoundSubtendedDirections(b, p).cosTheta;
        Float sinTheta_u = SafeSqrt(1 - cosTheta_u * cosTheta_u);

        // Compute $\cos \theta_\roman{p}$ for _intr_ and test against $\cos
        // \theta_\roman{e}$
        // cos(theta_p). Compute in two steps
        Float cosTheta_x = cosSubClamped(
            sinTheta, cosTheta, SafeSqrt(1 - cosTheta_o * cosTheta_o), cosTheta_o);
        Float sinTheta_x = sinSubClamped(
            sinTheta, cosTheta, SafeSqrt(1 - cosTheta_o * cosTheta_o), cosTheta_o);
        Float cosTheta_p = cosSubClamped(sinTheta_x, cosTheta_x, sinTheta_u, cosTheta_u);
        if (cosTheta_p <= cosTheta_e)
            return 0;

        Float imp = phi * cosTheta_p / d2;
        DCHECK_GE(imp, -1e-3);

        // Account for $\cos \theta_\roman{i}$ in importance at surfaces
        if (n != Normal3f(0, 0, 0)) {
            // cos(thetap_i) = cos(max(0, theta_i - theta_u))
            // cos (a-b) = cos a cos b + sin a sin b
            Float cosTheta_i = AbsDot(wi, n);
            Float sinTheta_i = SafeSqrt(1 - cosTheta_i * cosTheta_i);
            Float cosThetap_i =
                cosSubClamped(sinTheta_i, cosTheta_i, sinTheta_u, cosTheta_u);
            imp *= cosThetap_i;
        }

        return std::max<Float>(imp, 0);
    }